

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sys_lnx_UdevDevice.h
# Opt level: O0

bool __thiscall
axl::sys::lnx::UdevDevice::createFromSysPath(UdevDevice *this,udev *ctx,StringRef *path)

{
  undefined *puVar1;
  bool bVar2;
  C *pCVar3;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *in_RSI;
  udev_device *in_stack_ffffffffffffffc8;
  
  puVar1 = libudev::udev_device_new_from_syspath;
  pCVar3 = sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::sz(in_RSI);
  (*(code *)puVar1)(in_RSI,pCVar3);
  sl::
  Handle<axl::sys::lnx::libudev::udev_device_*,_axl::sys::lnx::UnrefUdevDevice,_axl::sl::Zero<axl::sys::lnx::libudev::udev_device_*>_>
  ::attach((Handle<axl::sys::lnx::libudev::udev_device_*,_axl::sys::lnx::UnrefUdevDevice,_axl::sl::Zero<axl::sys::lnx::libudev::udev_device_*>_>
            *)in_RSI,in_stack_ffffffffffffffc8);
  bVar2 = completeUdev(SUB81((ulong)in_RSI >> 0x38,0),(char *)in_stack_ffffffffffffffc8);
  return bVar2;
}

Assistant:

bool
	createFromSysPath(
		udev* ctx,
		const sl::StringRef& path
	) {
		attach(udev_device_new_from_syspath(ctx, path.sz()));
		return completeUdev(m_h, "udev_device_new_from_syspath");
	}